

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O0

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_baseline
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances)

{
  Instance instance;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  string local_98;
  Vertex local_68;
  Vertex VStack_60;
  undefined1 local_50 [8];
  Plan plan;
  int i;
  vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
  *instances_local;
  vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
  *agents_local;
  MultiAgentPlanner *this_local;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *plans;
  
  plan._31_1_ = 0;
  std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::vector
            (__return_storage_ptr__);
  for (plan.cost = 0.0; uVar1 = (ulong)(int)plan.cost,
      sVar2 = std::
              vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
              ::size(agents), uVar1 < sVar2; plan.cost = (float)((int)plan.cost + 1)) {
    pvVar3 = std::
             vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
             ::operator[](agents,(long)(int)plan.cost);
    pvVar4 = std::
             vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
             ::operator[](instances,(long)(int)plan.cost);
    local_68 = pvVar4->start;
    VStack_60 = pvVar4->goal;
    instance.start = pvVar4->start;
    instance.goal = pvVar4->goal;
    PlanningAgent::computeSingleAgentPlan((Plan *)local_50,pvVar3,instance);
    std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::push_back
              (__return_storage_ptr__,(value_type *)local_50);
    pvVar3 = std::
             vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
             ::operator[](agents,(long)(int)plan.cost);
    PlanningAgent::planToString_abi_cxx11_(&local_98,pvVar3,(Plan *)local_50);
    std::operator<<((ostream *)&std::cout,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    Plan::~Plan((Plan *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_baseline(vector<PlanningAgent>& agents, 
																	            const vector<Instance>& instances) {
	vector<Plan> plans;

	for (int i = 0; i < agents.size(); ++i) {
		Plan plan = agents[i].computeSingleAgentPlan(instances[i]);
		plans.push_back(plan);

		cout << agents[i].planToString(plan);
	}

	return plans;
}